

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O1

int Granulator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  float *src;
  float fVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float *pfVar20;
  float *pfVar21;
  uint uVar22;
  float *pfVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  MutexScopeLock mutexScope;
  MutexScopeLock local_38;
  
  pfVar2 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar2 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    uVar22 = (uint)pfVar2[0xc];
    local_38.mutex = (Mutex *)0x0;
    if (-1 < (int)uVar22) {
      local_38.mutex = (Mutex *)sampleMutex;
    }
    fVar25 = (float)(int)(state->field_0).field_0.samplerate;
    fVar26 = pfVar2[5];
    if (-1 < (int)uVar22) {
      Mutex::Lock(local_38.mutex);
    }
    pfVar2[0x13b9] = (float)inchannels;
    if ((int)uVar22 < 0) {
      pfVar23 = pfVar2 + 0x13b4;
    }
    else {
      if (GetGranulatorSample(int)::initialized == '\0') {
        memset(GetGranulatorSample(int)::samples,0,0x4280);
        GetGranulatorSample(int)::initialized = '\x01';
      }
      pfVar23 = (float *)(GetGranulatorSample(int)::samples + (ulong)uVar22 * 0x428);
    }
    if (length != 0) {
      uVar14 = 0;
      do {
        if (0 < inchannels) {
          uVar16 = 0;
          bVar9 = false;
          do {
            bVar18 = bVar9;
            uVar24 = -(uint)(pfVar2[uVar16 + 0xf] < ABS(inbuffer[uVar16]) + 1e-11);
            fVar15 = (float)(~uVar24 & (uint)(pfVar2[uVar16 + 0xf] * 0.9995) |
                            (uint)(ABS(inbuffer[uVar16]) + 1e-11) & uVar24);
            bVar5 = fVar26 + fVar26 < fVar15;
            pfVar2[uVar16 + 0xf] = fVar15;
            uVar16 = uVar16 + 1;
            bVar9 = (bool)(bVar18 | bVar5);
          } while ((uint)inchannels != uVar16);
          if (bVar18 || bVar5) {
            fVar15 = (float)((int)pfVar2[0xe] - 1U & 0x3ffff);
            pfVar2[0xe] = fVar15;
            if (0 < inchannels) {
              lVar17 = (ulong)(uint)((int)fVar15 * inchannels) * 4;
              lVar13 = *(long *)(pfVar2 + 0x13b6);
              lVar3 = *(long *)(pfVar2 + 0x13b4);
              uVar16 = 0;
              do {
                *(float *)(lVar17 + lVar3 + uVar16 * 4) = inbuffer[uVar16];
                dVar27 = *(double *)(pfVar2 + uVar16 * 2 + 0x18) * 0.9998999834060669 +
                         (double)ABS(inbuffer[uVar16]);
                *(double *)(pfVar2 + uVar16 * 2 + 0x18) = dVar27;
                *(float *)(lVar13 + lVar17 + uVar16 * 4) = (float)dVar27;
                uVar16 = uVar16 + 1;
              } while ((uint)inchannels != uVar16);
            }
          }
        }
        uVar14 = uVar14 + 1;
        inbuffer = inbuffer + inchannels;
      } while (uVar14 != length);
    }
    memset(outbuffer,0,(ulong)(outchannels * length) << 2);
    uVar14 = (state->field_0).field_0.flags;
    if ((uVar14 & 6) == 0) {
      if ((uVar14 & 1) == 0) {
        lVar13 = 200;
        do {
          *(undefined4 *)((long)pfVar2 + lVar13) = 0x3f800000;
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0x4ee8);
      }
      else {
        debug_graincount = pfVar2[0x2a];
        if (length != 0) {
          fVar26 = pfVar2[0x28];
          fVar15 = pfVar2[8] * pfVar2[0x29] + pfVar2[7];
          uVar14 = -(uint)(0.0 < fVar15);
          fVar15 = (float)(~uVar14 & 0x4cbebc20 | (uint)(fVar25 / fVar15) & uVar14);
          uVar14 = 0;
          do {
            fVar26 = fVar26 + 1.0;
            if (fVar15 <= fVar26) {
              fVar10 = (float)((int)pfVar2[0xd] * 0x19660d + 0x3c6ef35f);
              pfVar2[0xd] = fVar10;
              fVar29 = (float)((uint)fVar10 & 0xffffff ^ (uint)fVar10 >> 0x10) * 5.960465e-08 + 0.0;
              pfVar2[0x29] = fVar29;
              fVar26 = fVar26 - fVar15;
              fVar15 = fVar29 * pfVar2[8] + pfVar2[7];
              uVar24 = -(uint)(0.0 < fVar15);
              fVar15 = (float)(~uVar24 & 0x4cbebc20 | (uint)(fVar25 / fVar15) & uVar24);
              fVar29 = pfVar2[0x2a];
              if (((long)(int)fVar29 < 500) && (fVar28 = pfVar23[4], fVar28 != 0.0)) {
                pfVar2[0x2a] = (float)((int)fVar29 + 1);
                fVar19 = (float)((int)fVar10 * 0x19660d + 0x3c6ef35f);
                pfVar2[0xd] = fVar19;
                fVar10 = pfVar23[5];
                fVar30 = 0.0;
                if ((int)uVar22 < 0) {
                  fVar30 = (float)(int)pfVar2[0xe];
                }
                pfVar21 = pfVar2 + (long)(int)fVar29 * 10 + 0x2c;
                *(float **)pfVar21 = pfVar23;
                pfVar21[2] = (float)(((uint)fVar19 >> 0x10 ^ (uint)fVar19) % (uint)fVar10);
                pfVar21[4] = (float)(uVar22 >> 0x1f);
                fVar31 = (float)((int)fVar28 + -1);
                fVar29 = pfVar2[1];
                fVar10 = (float)((int)fVar19 * 0x19660d + 0x3c6ef35f);
                pfVar2[0xd] = fVar10;
                fVar28 = ((float)((uint)fVar10 & 0xffffff ^ (uint)fVar10 >> 0x10) *
                          ((pfVar2[4] + fVar29) - fVar29) * 5.960465e-08 + fVar29) * fVar31;
                pfVar21[3] = (float)(int)fVar28;
                fVar10 = pfVar2[6] - pfVar2[3];
                fVar29 = (float)((int)fVar19 * 0x17385ca9 + 0x47502932);
                pfVar2[0xd] = fVar29;
                fVar10 = (float)((uint)fVar29 & 0xffffff ^ (uint)fVar29 >> 0x10) *
                         (pfVar2[6] - fVar10) * 5.960465e-08 + fVar10;
                pfVar21[5] = ((ABS(fVar10) - ABS(fVar10 + -1.0)) + 1.0) * 0.5 * fVar31 + fVar30;
                fVar29 = *pfVar2;
                fVar10 = (float)((int)fVar19 * -0x50b6f56b + -0x2e330917);
                pfVar2[0xd] = fVar10;
                fVar29 = (float)((uint)fVar10 & 0xffffff ^ (uint)fVar10 >> 0x10) *
                         ((pfVar2[2] + fVar29) - fVar29) * 5.960465e-08 + fVar29;
                fVar29 = (float)(int)pfVar23[6] *
                         (ABS(0.001 - fVar29) + fVar29 + 0.001) * 0.5 * (1.0 / (float)(int)fVar28) *
                         (1.0 / fVar25);
                pfVar21[7] = fVar29;
                pfVar21[6] = -fVar29 * ((1.0 - fVar26) + (float)(int)uVar14);
                fVar29 = pfVar2[10];
                fVar10 = (float)((int)fVar19 * 0x979e791 + -0x5506accc);
                pfVar2[0xd] = fVar10;
                pfVar21[8] = ((float)((uint)fVar10 & 0xffffff ^ (uint)fVar10 >> 0x10) *
                              (fVar29 + fVar29) * 5.960465e-08 - fVar29) + pfVar2[9];
                pfVar21[9] = pfVar2[0xb];
              }
            }
            uVar14 = uVar14 + 1;
          } while (length != uVar14);
          pfVar2[0x28] = fVar26;
        }
        pfVar23 = pfVar2 + (long)(int)pfVar2[0x2a] * 10 + 0x2c;
        if (0 < (long)(int)pfVar2[0x2a]) {
          pfVar21 = pfVar2 + 0x2c;
          do {
            if (length != 0) {
              plVar4 = *(long **)pfVar21;
              lVar13 = (long)(int)pfVar21[2] * 4 + *plVar4;
              fVar26 = pfVar21[3];
              iVar1 = (int)plVar4[2];
              pfVar20 = outbuffer + 1;
              uVar22 = length;
              do {
                fVar25 = pfVar21[6];
                fVar15 = (ABS(0.0 - fVar25) + fVar25 + 0.0) * 0.5;
                pfVar21[6] = fVar25 + pfVar21[7];
                fVar29 = (1.0 - ABS(fVar15 + fVar15 + -1.0)) * pfVar21[9];
                fVar25 = fVar15 * (float)(int)fVar26 + pfVar21[5];
                fVar15 = floorf(fVar25);
                iVar11 = (int)fVar15;
                if ((iVar11 < iVar1) || (iVar11 = iVar11 - iVar1, pfVar21[4] != 0.0)) {
                  fVar10 = ((ABS(fVar29) - ABS(fVar29 + -1.0)) + 1.0) * 0.5;
                  iVar12 = iVar11 + 1;
                  fVar29 = *(float *)(lVar13 + (long)(*(int *)((long)plVar4 + 0x14) * iVar11) * 4);
                  if ((iVar12 < iVar1) || (iVar12 = iVar12 - iVar1, pfVar21[4] != 0.0)) {
                    fVar10 = fVar10 * ((*(float *)(lVar13 + (long)(iVar12 * *(int *)((long)plVar4 +
                                                                                    0x14)) * 4) -
                                       fVar29) * (fVar25 - (float)(int)fVar15) + fVar29);
                  }
                  else {
                    fVar10 = fVar10 * fVar29;
                  }
                }
                else {
                  fVar10 = 0.0;
                }
                pfVar20[-1] = (1.0 - pfVar21[8]) * fVar10 + pfVar20[-1];
                *pfVar20 = fVar10 * pfVar21[8] + *pfVar20;
                pfVar20 = pfVar20 + outchannels;
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            if (0.99999 <= pfVar21[6]) {
              *(undefined8 *)(pfVar21 + 8) = *(undefined8 *)(pfVar23 + -2);
              uVar6 = *(undefined8 *)(pfVar23 + -10);
              uVar7 = *(undefined8 *)(pfVar23 + -8);
              pfVar20 = pfVar23 + -6;
              uVar8 = *(undefined8 *)(pfVar23 + -4);
              pfVar23 = pfVar23 + -10;
              *(undefined8 *)(pfVar21 + 4) = *(undefined8 *)pfVar20;
              *(undefined8 *)(pfVar21 + 6) = uVar8;
              *(undefined8 *)pfVar21 = uVar6;
              *(undefined8 *)(pfVar21 + 2) = uVar7;
            }
            else {
              pfVar21 = pfVar21 + 10;
            }
          } while (pfVar21 < pfVar23);
        }
        pfVar2[0x2a] = (float)((int)((ulong)((long)pfVar23 - (long)(pfVar2 + 0x2c)) >> 3) *
                              -0x33333333);
      }
    }
    MutexScopeLock::~MutexScopeLock(&local_38);
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]"
               );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const int samplerate = state->samplerate;
        const float sampletime = 1.0f / (float)samplerate;
        const float freeze = data->p[P_FREEZE] * 2.0f;
        const int usesample = (int)data->p[P_USESAMPLE];
        const float* params = data->p;

        MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);

        data->delay.numchannels = inchannels;

        GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;

        // Fill in live data
        const float* src = inbuffer;
        for (int n = 0; n < length; n++)
        {
            bool record = false;
            for (int i = 0; i < inchannels; i++)
            {
                float input = src[i];
                float a = fabsf(input) + 1.0e-11f;
                data->env[i] = (a > data->env[i]) ? a : (data->env[i] * 0.9995f);
                record |= (data->env[i] > freeze);
            }
            if (record)
            {
                data->delaypos = (data->delaypos + MAXDELAYLENGTH - 1) & (MAXDELAYLENGTH - 1);
                for (int i = 0; i < inchannels; i++)
                {
                    data->delay.data[data->delaypos * inchannels + i] = src[i];

                    // Calculate integrated signal on the fly for better reconstruction in GetFloatBufferCallback.
                    // The small leak of 0.1% prevents build-up of DC.
                    data->integrator[i] = data->integrator[i] * 0.9999f + fabsf(src[i]);
                    data->delay.preview[data->delaypos * inchannels + i] = data->integrator[i];
                }
            }
            src += inchannels;
        }

        memset(outbuffer, 0, length * outchannels * sizeof(float));

        if (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))
            return UNITY_AUDIODSP_OK;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0)
        {
            ResetGrains(data);
            return UNITY_AUDIODSP_OK;
        }

        debug_graincount = data->activegrains;

        // Fill in new grains
        float rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
        float nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
        for (int n = 0; n < length; n++)
        {
            if (++data->samplecounter >= nexteventsample)
            {
                data->samplecounter -= nexteventsample;
                float fracpos = 1.0f - data->samplecounter;
                data->nextrandtime = data->random.GetFloat(0.0f, 1.0f);
                rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
                nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
                if (data->activegrains >= MAXGRAINS || gs->numsamples == 0)
                    continue;
                data->grains[data->activegrains++].Setup(
                    gs,
                    data->random.Get() % gs->numchannels,
                    data->random,
                    sampletime,
                    (usesample >= 0) ? 0 : data->delaypos,
                    params,
                    n + fracpos,
                    usesample < 0
                    );
            }
        }

        // Process grains
        Grain* g = data->grains;
        Grain* g_end = data->grains + data->activegrains;
        while (g < g_end)
        {
            float* dst = outbuffer;
            for (int n = 0; n < length; n++)
            {
                float s = g->Scan();
                dst[0] += s * (1.0f - g->pan);
                dst[1] += s * g->pan;
                dst += outchannels;
            }
            if (g->pos >= 0.99999f)
                *g = *(--g_end);
            else
                ++g;
        }
        data->activegrains = g_end - data->grains;

        return UNITY_AUDIODSP_OK;
    }